

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O3

CURLcode h2_progress_ingress(Curl_cfilter *cf,Curl_easy *data)

{
  bufq *q;
  void *pvVar1;
  RTSP *pRVar2;
  void *pvVar3;
  Curl_cfilter *pCVar4;
  _Bool _Var5;
  uint in_EAX;
  int iVar6;
  size_t sVar7;
  ssize_t sVar8;
  char *pcVar9;
  ulong uVar10;
  CURLcode result;
  undefined8 uStack_38;
  
  pvVar1 = cf->ctx;
  uStack_38 = (ulong)in_EAX;
  q = (bufq *)((long)pvVar1 + 0x18);
  _Var5 = Curl_bufq_is_empty(q);
  if (!_Var5) {
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
       (0 < cf->cft->log_level)) {
      sVar7 = Curl_bufq_len(q);
      Curl_trc_cf_infof(data,cf,"Process %zu bytes in connection buffer",sVar7);
    }
    iVar6 = h2_process_pending_input(cf,data,(CURLcode *)((long)&uStack_38 + 4));
    if (iVar6 < 0) goto LAB_0062f0e9;
  }
  do {
    if ((((*(byte *)((long)pvVar1 + 200) & 1) != 0) || (_Var5 = Curl_bufq_is_empty(q), !_Var5)) ||
       ((((data != (Curl_easy *)0x0 &&
          ((pRVar2 = (data->req).p.rtsp, pRVar2 != (RTSP *)0x0 &&
           (pvVar3 = (pRVar2->http_wrapper).h2_ctx, pvVar3 != (void *)0x0)))) &&
         ((*(char *)((long)pvVar3 + 0x14d) != '\0' ||
          (_Var5 = Curl_bufq_is_full((bufq *)((long)pvVar3 + 8)), _Var5)))) &&
        ((pCVar4 = cf->next, pCVar4 == (Curl_cfilter *)0x0 ||
         (_Var5 = (*pCVar4->cft->has_data_pending)(pCVar4,data), !_Var5)))))) {
LAB_0062f124:
      if ((*(byte *)((long)pvVar1 + 200) & 1) == 0) {
        return CURLE_OK;
      }
      _Var5 = Curl_bufq_is_empty(q);
      if (!_Var5) {
        return CURLE_OK;
      }
      Curl_conncontrol(cf->conn,1);
      return CURLE_OK;
    }
    sVar8 = Curl_bufq_slurp(q,nw_in_reader,cf,(CURLcode *)((long)&uStack_38 + 4));
    if (sVar8 < 0) {
      uVar10 = (ulong)uStack_38._4_4_;
      if (uStack_38._4_4_ == CURLE_AGAIN) goto LAB_0062f124;
      pcVar9 = curl_easy_strerror(uStack_38._4_4_);
      Curl_failf(data,"Failed receiving HTTP2 data: %d(%s)",uVar10,pcVar9);
      break;
    }
    if (sVar8 == 0) {
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
         (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"[0] ingress: connection closed");
      }
      *(byte *)((long)pvVar1 + 200) = *(byte *)((long)pvVar1 + 200) | 1;
      goto LAB_0062f124;
    }
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
       (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"[0] ingress: read %zd bytes",sVar8);
    }
    iVar6 = h2_process_pending_input(cf,data,(CURLcode *)((long)&uStack_38 + 4));
  } while (iVar6 == 0);
LAB_0062f0e9:
  return uStack_38._4_4_;
}

Assistant:

static CURLcode h2_progress_ingress(struct Curl_cfilter *cf,
                                    struct Curl_easy *data)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  struct stream_ctx *stream;
  CURLcode result = CURLE_OK;
  ssize_t nread;

  /* Process network input buffer fist */
  if(!Curl_bufq_is_empty(&ctx->inbufq)) {
    CURL_TRC_CF(data, cf, "Process %zu bytes in connection buffer",
                Curl_bufq_len(&ctx->inbufq));
    if(h2_process_pending_input(cf, data, &result) < 0)
      return result;
  }

  /* Receive data from the "lower" filters, e.g. network until
   * it is time to stop due to connection close or us not processing
   * all network input */
  while(!ctx->conn_closed && Curl_bufq_is_empty(&ctx->inbufq)) {
    stream = H2_STREAM_CTX(data);
    if(stream && (stream->closed || Curl_bufq_is_full(&stream->recvbuf))) {
      /* We would like to abort here and stop processing, so that
       * the transfer loop can handle the data/close here. However,
       * this may leave data in underlying buffers that will not
       * be consumed. */
      if(!cf->next || !cf->next->cft->has_data_pending(cf->next, data))
        break;
    }

    nread = Curl_bufq_slurp(&ctx->inbufq, nw_in_reader, cf, &result);
    if(nread < 0) {
      if(result != CURLE_AGAIN) {
        failf(data, "Failed receiving HTTP2 data: %d(%s)", result,
              curl_easy_strerror(result));
        return result;
      }
      break;
    }
    else if(nread == 0) {
      CURL_TRC_CF(data, cf, "[0] ingress: connection closed");
      ctx->conn_closed = TRUE;
      break;
    }
    else {
      CURL_TRC_CF(data, cf, "[0] ingress: read %zd bytes",
                  nread);
    }

    if(h2_process_pending_input(cf, data, &result))
      return result;
  }

  if(ctx->conn_closed && Curl_bufq_is_empty(&ctx->inbufq)) {
    connclose(cf->conn, "GOAWAY received");
  }

  return CURLE_OK;
}